

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

uchar * glfwGetJoystickButtons(int joy,int *count)

{
  uchar *puVar1;
  int error;
  
  *count = 0;
  if (_glfwInitialized == '\0') {
    error = 0x10001;
  }
  else {
    if ((uint)joy < 0x10) {
      puVar1 = _glfwPlatformGetJoystickButtons(joy,count);
      return puVar1;
    }
    error = 0x10003;
  }
  _glfwInputError(error,(char *)0x0);
  return (uchar *)0x0;
}

Assistant:

char* glfwGetJoystickButtons(int joy, int* count)
{
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (joy < 0 || joy > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, NULL);
        return NULL;
    }

    return _glfwPlatformGetJoystickButtons(joy, count);
}